

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3StrICmp(char *zLeft,char *zRight)

{
  uint uVar1;
  int x;
  int c;
  uchar *b;
  uchar *a;
  char *zRight_local;
  char *zLeft_local;
  
  b = (uchar *)zRight;
  a = (uchar *)zLeft;
  do {
    uVar1 = (uint)*a;
    if (uVar1 == *b) {
      if (uVar1 == 0) {
        return 0;
      }
    }
    else if ((uint)""[(int)uVar1] - (uint)""[(int)(uint)*b] != 0) {
      return (uint)""[(int)uVar1] - (uint)""[(int)(uint)*b];
    }
    a = a + 1;
    b = b + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3StrICmp(const char *zLeft, const char *zRight){
  unsigned char *a, *b;
  int c, x;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  for(;;){
    c = *a;
    x = *b;
    if( c==x ){
      if( c==0 ) break;
    }else{
      c = (int)UpperToLower[c] - (int)UpperToLower[x];
      if( c ) break;
    }
    a++;
    b++;
  }
  return c;
}